

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cc
# Opt level: O1

bool __thiscall
google::protobuf::io::Tokenizer::NextWithComments
          (Tokenizer *this,string *prev_trailing_comments,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *detached_comments,string *next_leading_comments)

{
  undefined1 uVar1;
  NextCommentStatus NVar2;
  CommentCollector collector;
  long *local_90;
  undefined8 local_88;
  long local_80 [2];
  CommentCollector local_70;
  
  local_70.comment_buffer_._M_dataplus._M_p = (pointer)&local_70.comment_buffer_.field_2;
  local_70.comment_buffer_._M_string_length = 0;
  local_70.comment_buffer_.field_2._M_local_buf[0] = '\0';
  local_70.num_comments_ = 0;
  local_70.has_trailing_comment_ = false;
  local_70.has_comment_ = false;
  local_70.is_line_comment_ = false;
  local_70.can_attach_to_prev_ = true;
  if (prev_trailing_comments != (string *)0x0) {
    prev_trailing_comments->_M_string_length = 0;
    *(prev_trailing_comments->_M_dataplus)._M_p = '\0';
  }
  local_70.prev_trailing_comments_ = prev_trailing_comments;
  local_70.detached_comments_ = detached_comments;
  local_70.next_leading_comments_ = next_leading_comments;
  if (detached_comments !=
      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)0x0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase_at_end(detached_comments,
                      (detached_comments->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start);
  }
  if (next_leading_comments != (string *)0x0) {
    next_leading_comments->_M_string_length = 0;
    *(next_leading_comments->_M_dataplus)._M_p = '\0';
  }
  if ((this->current_).type != TYPE_START) {
    while (((ulong)(byte)this->current_char_ < 0x21 &&
           ((0x100003a00U >> ((ulong)(byte)this->current_char_ & 0x3f) & 1) != 0))) {
      NextChar(this);
    }
    NVar2 = TryConsumeCommentStart(this);
    uVar1 = (*(code *)(&DAT_0038a6a0 + *(int *)(&DAT_0038a6a0 + (ulong)NVar2 * 4)))();
    return (bool)uVar1;
  }
  if (this->current_char_ == -0x11) {
    NextChar(this);
    if ((this->current_char_ != -0x45) || (NextChar(this), this->current_char_ != -0x41)) {
      local_90 = local_80;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_90,
                 "Proto file starts with 0xEF but not UTF-8 BOM. Only UTF-8 is accepted for proto file."
                 ,"");
      (*this->error_collector_->_vptr_ErrorCollector[2])
                (this->error_collector_,(ulong)(uint)this->line_,(ulong)(uint)this->column_,local_88
                 ,local_90);
      if (local_90 != local_80) {
        operator_delete(local_90,local_80[0] + 1);
      }
      anon_unknown_0::CommentCollector::~CommentCollector(&local_70);
      return false;
    }
    NextChar(this);
  }
  local_70.can_attach_to_prev_ = false;
  while (((ulong)(byte)this->current_char_ < 0x21 &&
         ((0x100003a00U >> ((ulong)(byte)this->current_char_ & 0x3f) & 1) != 0))) {
    NextChar(this);
  }
  NVar2 = TryConsumeCommentStart(this);
  uVar1 = (*(code *)(&DAT_0038a6b0 + *(int *)(&DAT_0038a6b0 + (ulong)NVar2 * 4)))();
  return (bool)uVar1;
}

Assistant:

bool Tokenizer::NextWithComments(std::string* prev_trailing_comments,
                                 std::vector<std::string>* detached_comments,
                                 std::string* next_leading_comments) {
  CommentCollector collector(prev_trailing_comments, detached_comments,
                             next_leading_comments);

  int prev_line = line_;
  int trailing_comment_end_line = -1;

  if (current_.type == TYPE_START) {
    // Ignore unicode byte order mark(BOM) if it appears at the file
    // beginning. Only UTF-8 BOM (0xEF 0xBB 0xBF) is accepted.
    if (TryConsume(static_cast<char>(0xEF))) {
      if (!TryConsume(static_cast<char>(0xBB)) ||
          !TryConsume(static_cast<char>(0xBF))) {
        AddError(
            "Proto file starts with 0xEF but not UTF-8 BOM. "
            "Only UTF-8 is accepted for proto file.");
        return false;
      }
    }
    collector.DetachFromPrev();
    prev_line = -1;
  } else {
    // A comment appearing on the same line must be attached to the previous
    // declaration.
    ConsumeZeroOrMore<WhitespaceNoNewline>();
    switch (TryConsumeCommentStart()) {
      case LINE_COMMENT:
        trailing_comment_end_line = line_;
        ConsumeLineComment(collector.GetBufferForLineComment());

        // Don't allow comments on subsequent lines to be attached to a trailing
        // comment.
        collector.Flush();
        break;
      case BLOCK_COMMENT:
        ConsumeBlockComment(collector.GetBufferForBlockComment());
        trailing_comment_end_line = line_;
        ConsumeZeroOrMore<WhitespaceNoNewline>();

        // Don't allow comments on subsequent lines to be attached to a trailing
        // comment.
        collector.Flush();
        break;
      case SLASH_NOT_COMMENT:
        return true;
      case NO_COMMENT:
        if (!TryConsume('\n')) {
          // The next token is on the same line.  There are no comments.
          return Next();
        }
        break;
    }
  }

  // OK, we are now on the line *after* the previous token.
  while (true) {
    ConsumeZeroOrMore<WhitespaceNoNewline>();

    switch (TryConsumeCommentStart()) {
      case LINE_COMMENT:
        ConsumeLineComment(collector.GetBufferForLineComment());
        break;
      case BLOCK_COMMENT:
        ConsumeBlockComment(collector.GetBufferForBlockComment());

        // Consume the rest of the line so that we don't interpret it as a
        // blank line the next time around the loop.
        ConsumeZeroOrMore<WhitespaceNoNewline>();
        TryConsume('\n');
        break;
      case SLASH_NOT_COMMENT:
        return true;
      case NO_COMMENT:
        if (TryConsume('\n')) {
          // Completely blank line.
          collector.Flush();
          collector.DetachFromPrev();
        } else {
          bool result = Next();
          if (!result || current_.text == "}" || current_.text == "]" ||
              current_.text == ")") {
            // It looks like we're at the end of a scope.  In this case it
            // makes no sense to attach a comment to the following token.
            collector.Flush();
          }
          if (result &&
              (prev_line == line_ || trailing_comment_end_line == line_)) {
            // When previous token and this one are on the same line, or
            // even if a multi-line trailing comment ends on the same line
            // as this token, it's unclear to what token the comment
            // should be attached. So we detach it.
            collector.MaybeDetachComment();
          }
          return result;
        }
        break;
    }
  }
}